

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> __thiscall
enact::Parser::parseImplStmt(Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TokenType TVar2;
  undefined8 uVar3;
  CompileContext *pCVar4;
  ParseError *__return_storage_ptr__;
  pointer *__ptr;
  Parser *in_RSI;
  size_type __dnew;
  size_type __dnew_3;
  string local_88;
  undefined1 local_68 [16];
  undefined1 local_58 [24];
  CompileContext *local_40;
  _Alloc_hider local_38;
  
  paVar1 = &local_88.field_2;
  local_58._0_8_ = (pointer)0x1f;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  local_88._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)local_58);
  local_88.field_2._M_allocated_capacity = local_58._0_8_;
  builtin_strncpy(local_88._M_dataplus._M_p,"Expected typename after \'impl\'.",0x1f);
  local_88._M_string_length = local_58._0_8_;
  local_88._M_dataplus._M_p
  [(long)&((__uniq_ptr_data<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>,_true,_true>
            *)local_58._0_8_)->
          super___uniq_ptr_impl<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>] =
       '\0';
  expectTypenamePrecFunction((Parser *)(local_68 + 8),(string *)in_RSI,SUB81(&local_88,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((in_RSI->m_current).type == FOR) {
    advance(in_RSI);
    local_58._0_8_ = (pointer)0x26;
    local_88._M_dataplus._M_p = (pointer)paVar1;
    local_88._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)local_58);
    local_88.field_2._M_allocated_capacity = local_58._0_8_;
    builtin_strncpy(local_88._M_dataplus._M_p,"Expected typename after \'impl\'..\'for\'.",0x26);
    local_88._M_string_length = local_58._0_8_;
    local_88._M_dataplus._M_p
    [(long)&((__uniq_ptr_data<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>,_true,_true>
              *)local_58._0_8_)->
            super___uniq_ptr_impl<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>] =
         '\0';
    expectTypenamePrecFunction((Parser *)local_68,(string *)in_RSI,SUB81(&local_88,0));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_68._0_8_ = (CompileContext *)0x0;
  }
  local_58._0_8_ = (pointer)0x1e;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  local_88._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)local_58);
  local_88.field_2._M_allocated_capacity = local_58._0_8_;
  builtin_strncpy((char *)((long)local_88._M_dataplus._M_p + 0xe),"efore im",8);
  builtin_strncpy((char *)((long)local_88._M_dataplus._M_p + 0x16),"pl body.",8);
  *(undefined8 *)local_88._M_dataplus._M_p = 0x6465746365707845;
  *(undefined8 *)((long)local_88._M_dataplus._M_p + 8) = 0x66656220277b2720;
  local_88._M_string_length = local_58._0_8_;
  *(char *)((long)&(((__uniq_ptr_data<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>,_true,_true>
                      *)local_58._0_8_)->
                   super___uniq_ptr_impl<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>
                   )._M_t.
                   super__Tuple_impl<0UL,_enact::FunctionStmt_*,_std::default_delete<enact::FunctionStmt>_>
                   .super__Head_base<0UL,_enact::FunctionStmt_*,_false> +
           (long)local_88._M_dataplus._M_p) = '\0';
  expect(in_RSI,LEFT_BRACE,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (pointer)0x0;
  local_58._16_8_ = 0;
  while (TVar2 = (in_RSI->m_current).type, TVar2 == FUNC) {
    advance(in_RSI);
    parseFunctionStmt((Parser *)&stack0xffffffffffffffc0,SUB81(in_RSI,0));
    local_88._M_dataplus._M_p = (pointer)local_40;
    std::
    vector<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>,std::allocator<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>>>
    ::emplace_back<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>>
              ((vector<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>,std::allocator<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>>>
                *)local_58,
               (unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_> *)
               &local_88);
    if ((long *)local_88._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
    }
    local_40 = (CompileContext *)0x0;
  }
  if ((TVar2 != RIGHT_BRACE) && (TVar2 != END_OF_FILE)) {
    __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Expected method declaration in impl body.","");
    errorAtCurrent(__return_storage_ptr__,in_RSI,&local_88);
    __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_38._M_p = (pointer)0x1d;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  local_88._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&stack0xffffffffffffffc8);
  local_88.field_2._M_allocated_capacity = (size_type)local_38._M_p;
  builtin_strncpy(local_88._M_dataplus._M_p,"Expected \'}\' after impl body.",0x1d);
  local_88._M_string_length = (size_type)local_38._M_p;
  local_88._M_dataplus._M_p[(long)local_38._M_p] = '\0';
  expect(in_RSI,RIGHT_BRACE,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  uVar3 = local_68._0_8_;
  if ((CompileContext *)local_68._0_8_ == (CompileContext *)0x0) {
    pCVar4 = (CompileContext *)operator_new(0x30);
    (pCVar4->m_source)._M_dataplus._M_p = (pointer)&PTR__ImplStmt_001270e0;
    (pCVar4->m_source)._M_string_length = local_68._8_8_;
    (pCVar4->m_source).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pCVar4->m_source).field_2 + 8) = local_58._0_8_;
    (pCVar4->m_options).m_filename._M_dataplus._M_p = (pointer)local_58._8_8_;
    (pCVar4->m_options).m_filename._M_string_length = local_58._16_8_;
  }
  else {
    pCVar4 = (CompileContext *)operator_new(0x30);
    (pCVar4->m_source)._M_dataplus._M_p = (pointer)&PTR__ImplStmt_001270e0;
    (pCVar4->m_source)._M_string_length = uVar3;
    (pCVar4->m_source).field_2._M_allocated_capacity = local_68._8_8_;
    *(undefined8 *)((long)&(pCVar4->m_source).field_2 + 8) = local_58._0_8_;
    (pCVar4->m_options).m_filename._M_dataplus._M_p = (pointer)local_58._8_8_;
    (pCVar4->m_options).m_filename._M_string_length = local_58._16_8_;
  }
  local_58._16_8_ = 0;
  local_58._8_8_ = 0;
  local_58._0_8_ = (pointer)0x0;
  local_68._8_8_ = (long *)0x0;
  local_68._0_8_ = (CompileContext *)0x0;
  local_88.field_2._M_allocated_capacity = 0;
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  std::
  vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
  ::~vector((vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
             *)&local_88);
  this->m_context = pCVar4;
  std::
  vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
  ::~vector((vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
             *)local_58);
  if ((CompileContext *)local_68._0_8_ != (CompileContext *)0x0) {
    (**(code **)((((string *)local_68._0_8_)->_M_dataplus)._M_p + 8))();
  }
  if ((long *)local_68._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_68._8_8_ + 8))();
  }
  return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::parseImplStmt() {
        std::unique_ptr<const Typename> firstTypename = expectTypename("Expected typename after 'impl'.");
        std::unique_ptr<const Typename> secondTypename = consume(TokenType::FOR)
                                                         ? expectTypename("Expected typename after 'impl'..'for'.")
                                                         : nullptr;

        expect(TokenType::LEFT_BRACE, "Expected '{' before impl body.");

        std::vector<std::unique_ptr<FunctionStmt>> methods;
        while (!check(TokenType::RIGHT_BRACE) && !isAtEnd()) {
            if (consume(TokenType::FUNC)) {
                methods.push_back(
                        static_unique_ptr_cast<FunctionStmt>(
                                parseFunctionStmt()));
            } else {
                throw errorAtCurrent("Expected method declaration in impl body.");
            }
        }

        expect(TokenType::RIGHT_BRACE, "Expected '}' after impl body.");

        if (secondTypename == nullptr) {
            // Inherent impl
            return std::make_unique<ImplStmt>(std::move(firstTypename), std::move(secondTypename), std::move(methods));
        }
        // Trait impl
        return std::make_unique<ImplStmt>(std::move(secondTypename), std::move(firstTypename), std::move(methods));
    }